

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

CTPNStm * __thiscall CTcParser::parse_return(CTcParser *this,int *err)

{
  tc_toktyp_t tVar1;
  int iVar2;
  CTPNStmBase *pCVar3;
  CTcPrsNode *pCVar4;
  int *siz;
  
  siz = err;
  tVar1 = CTcTokenizer::next(G_tok);
  if (tVar1 - TOKT_LBRACE < 2) {
    CTcTokenizer::log_error_curtok(G_tok,0x2b2d);
  }
  else {
    if (tVar1 == TOKT_SEM) {
      CTcTokenizer::next(G_tok);
      pCVar3 = (CTPNStmBase *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x28,(size_t)siz);
      CTPNStmBase::CTPNStmBase(pCVar3);
      pCVar3[1].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)0x0;
      (pCVar3->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
           (_func_int **)&PTR_gen_code_00321470;
      return (CTPNStm *)pCVar3;
    }
    pCVar3 = (CTPNStmBase *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x28,(size_t)siz);
    pCVar4 = parse_expr(this);
    CTPNStmBase::CTPNStmBase(pCVar3);
    pCVar3[1].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar4;
    (pCVar3->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
         (_func_int **)&PTR_gen_code_00321470;
    iVar2 = parse_req_sem();
    if (iVar2 == 0) {
      return (CTPNStm *)pCVar3;
    }
    *err = 1;
  }
  return (CTPNStm *)0x0;
}

Assistant:

CTPNStm *CTcParser::parse_return(int *err)
{
    CTPNStm *stm;
    
    /* skip the 'return' keyword and see what we have */
    switch(G_tok->next())
    {
    case TOKT_SEM:
        /* 
         *   end of the statement - this is a void return; skip the
         *   semicolon, and return a void return statement node 
         */
        G_tok->next();
        stm = new CTPNStmReturn(0);
        break;

    case TOKT_LBRACE:
    case TOKT_RBRACE:
        /* 
         *   they probably just left out a semicolon - flag the error, and
         *   continue parsing from this token 
         */
        G_tok->log_error_curtok(TCERR_RET_REQ_EXPR);
        return 0;

    default:
        /* it's a return with an expression - parse the expression */
        stm = new CTPNStmReturn(parse_expr());

        /* make sure we're on a semicolon */
        if (parse_req_sem())
        {
            *err = TRUE;
            return 0;
        }

        /* done */
        break;
    }

    /* return the statement node we created */
    return stm;
}